

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  pointer pcVar1;
  pointer paVar2;
  bool bVar3;
  void *pvVar4;
  pointer __x;
  ByteData actual;
  Secp256k1 secp;
  CombinePubkeyTestVector test_vector;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [3];
  AssertHelper local_78;
  Secp256k1 local_70 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pvVar4 = (void *)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(local_70,pvVar4);
  paVar2 = combine_error_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (combine_error_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      combine_error_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = combine_error_vectors.
          super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_68,&__x->pubkeys);
      pcVar1 = (__x->expect)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + (__x->expect)._M_string_length);
      bVar3 = testing::internal::AlwaysTrue();
      if ((bVar3) &&
         (cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((vector *)local_90),
         local_90[0].ptr_ !=
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        operator_delete(local_90[0].ptr_);
      }
      testing::Message::Message((Message *)local_90);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x9c,
                 "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_78,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_90[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_90[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90[0].ptr_ + 8))();
        }
        local_90[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_68);
      __x = __x + 1;
    } while (__x != paVar2);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}